

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppEmitter.cpp
# Opt level: O2

void __thiscall
calc4::anon_unknown_0::Visitor<__int128>::Visit
          (Visitor<__int128> *this,shared_ptr<const_calc4::BinaryOperator> *op)

{
  char *pcVar1;
  VariableName name;
  VariableName name_00;
  ostream *poVar2;
  
  name.no = ProcessOperator(this,&((op->
                                   super___shared_ptr<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr)->left);
  name_00.no = ProcessOperator(this,&((op->
                                      super___shared_ptr<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr)->right);
  pcVar1 = (&PTR_anon_var_dwarf_59d66_00148c18)
           [(int)((op->super___shared_ptr<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr)->type];
  AppendVariableDeclarationBegin(this);
  poVar2 = operator<<(this->os,name);
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = std::operator<<(poVar2,pcVar1);
  poVar2 = std::operator<<(poVar2,' ');
  operator<<(poVar2,name_00);
  if (((op->super___shared_ptr<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      type - Equal < 6) {
    std::operator<<(this->os," ? 1 : 0");
  }
  AppendVariableDeclarationEnd(this);
  Return(this,(optional<int>)0x0);
  return;
}

Assistant:

virtual void Visit(const std::shared_ptr<const BinaryOperator>& op) override
    {
        int left = ProcessOperator(op->GetLeft());
        int right = ProcessOperator(op->GetRight());

        const char* operatorChar;
        switch (op->GetType())
        {
        case BinaryType::Add:
            operatorChar = "+";
            break;
        case BinaryType::Sub:
            operatorChar = "-";
            break;
        case BinaryType::Mult:
            operatorChar = "*";
            break;
        case BinaryType::Div:
            operatorChar = "/";
            break;
        case BinaryType::Mod:
            operatorChar = "%";
            break;
        case BinaryType::Equal:
            operatorChar = "==";
            break;
        case BinaryType::NotEqual:
            operatorChar = "!=";
            break;
        case BinaryType::LessThan:
            operatorChar = "<";
            break;
        case BinaryType::LessThanOrEqual:
            operatorChar = "<=";
            break;
        case BinaryType::GreaterThanOrEqual:
            operatorChar = ">=";
            break;
        case BinaryType::GreaterThan:
            operatorChar = ">";
            break;
        default:
            UNREACHABLE();
            break;
        }

        AppendVariableDeclarationBegin();
        os << VariableName(left) << ' ' << operatorChar << ' ' << VariableName(right);
        switch (op->GetType())
        {
        case BinaryType::Equal:
        case BinaryType::NotEqual:
        case BinaryType::LessThan:
        case BinaryType::LessThanOrEqual:
        case BinaryType::GreaterThanOrEqual:
        case BinaryType::GreaterThan:
            os << " ? 1 : 0";
            break;
        default:
            break;
        }
        AppendVariableDeclarationEnd();
        Return();
    }